

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

WildcardUdpPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardUdpPortListSyntax,slang::syntax::WildcardUdpPortListSyntax_const&>
          (BumpAllocator *this,WildcardUdpPortListSyntax *args)

{
  undefined4 uVar1;
  WildcardUdpPortListSyntax *pWVar2;
  long lVar3;
  WildcardUdpPortListSyntax *pWVar4;
  byte bVar5;
  
  bVar5 = 0;
  pWVar2 = (WildcardUdpPortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WildcardUdpPortListSyntax *)this->endPtr < pWVar2 + 1) {
    pWVar2 = (WildcardUdpPortListSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pWVar2 + 1);
  }
  pWVar4 = pWVar2;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_UdpPortListSyntax).super_SyntaxNode.field_0x4;
    (pWVar4->super_UdpPortListSyntax).super_SyntaxNode.kind =
         (args->super_UdpPortListSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pWVar4->super_UdpPortListSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (WildcardUdpPortListSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pWVar4 = (WildcardUdpPortListSyntax *)((long)pWVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pWVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }